

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O3

bool xercesc_4_0::XMLUri::isConformantSchemeName(XMLCh *scheme)

{
  bool bVar1;
  bool bVar2;
  XMLCh theChar;
  int iVar3;
  XMLCh *pXVar4;
  
  if ((scheme == (XMLCh *)0x0) || (bVar1 = XMLString::isAlpha(*scheme), !bVar1)) {
LAB_00253fe7:
    bVar1 = false;
  }
  else {
    theChar = scheme[1];
    bVar1 = true;
    if (theChar != L'\0') {
      pXVar4 = scheme + 2;
      do {
        bVar2 = XMLString::isAlphaNum(theChar);
        if ((!bVar2) && (iVar3 = XMLString::indexOf(L"+-.",pXVar4[-1]), iVar3 == -1))
        goto LAB_00253fe7;
        theChar = *pXVar4;
        pXVar4 = pXVar4 + 1;
      } while (theChar != L'\0');
    }
  }
  return bVar1;
}

Assistant:

bool XMLUri::isConformantSchemeName(const XMLCh* const scheme)
{
	if ( !scheme )
        return false;

    const XMLCh* tmpStr = scheme;
    if (!XMLString::isAlpha(*tmpStr))     // first: alpha
        return false;

    // second onwards: ( alpha | digit | "+" | "-" | "." )
    tmpStr++;
    while (*tmpStr)
    {
        if ( !XMLString::isAlphaNum(*tmpStr) &&
             (XMLString::indexOf(SCHEME_CHARACTERS, *tmpStr) == -1))
            return false;

        tmpStr++;
    }

    return true;
}